

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O2

int __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZQuadraticTetra> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_91;
  string local_90;
  TPZQuadraticTetra local_70;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"TPZGeoElRefLess",&local_91);
  uVar1 = Hash(&local_90);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  pzgeom::TPZQuadraticTetra::TPZQuadraticTetra(&local_70);
  iVar3 = pzgeom::TPZQuadraticTetra::ClassId(&local_70);
  pzgeom::TPZQuadraticTetra::~TPZQuadraticTetra(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}